

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArray<bool,_false,_false>::DirectGetItem(TypedArray<bool,_false,_false> *this,uint32 index)

{
  uint uVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  
  if (index < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length) {
    uVar1 = (this->super_TypedArrayBase).byteOffset;
    uVar5 = (*(((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->
              super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
    if ((ulong)uVar5 < (ulong)index + (ulong)uVar1 + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0xccf,
                                  "((index+1)* sizeof(bool) +GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                  ,
                                  "(index+1)* sizeof(bool) +GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                                 );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pJVar2 = (((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
               super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    if ((this->super_TypedArrayBase).buffer[index] == '\x01') {
      pTVar7 = &(pJVar2->super_JavascriptLibraryBase).booleanTrue;
    }
    else {
      pTVar7 = &(pJVar2->super_JavascriptLibraryBase).booleanFalse;
    }
  }
  else {
    pTVar7 = (Type *)&(((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                          super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                       ptr)->super_JavascriptLibraryBase).undefinedValue;
  }
  return pTVar7->ptr;
}

Assistant:

inline Var BoolArray::DirectGetItem(__in uint32 index)
    {
        if (index < GetLength())
        {
            Assert((index+1)* sizeof(bool) +GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            bool* typedBuffer = (bool*)buffer;
            return typedBuffer[index] ? GetLibrary()->GetTrue() : GetLibrary()->GetFalse();
        }
        return GetLibrary()->GetUndefined();
    }